

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::BytesToHumanReadableString_abi_cxx11_
          (string *__return_storage_ptr__,StringUtil *this,idx_t bytes,idx_t multiplier)

{
  unsigned_long *puVar1;
  idx_t iVar2;
  StringUtil *pSVar3;
  idx_t i;
  long lVar4;
  char *__rhs;
  string *this_00;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_f8;
  idx_t array [6];
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this_00 = &bStack_f8;
  array[1] = 0;
  array[4] = 0;
  array[5] = 0;
  array[2] = 0;
  array[3] = 0;
  array[0] = (idx_t)this;
  pSVar3 = this;
  for (lVar4 = 1; lVar4 != 6; lVar4 = lVar4 + 1) {
    array[lVar4] = (idx_t)((ulong)pSVar3 / bytes);
    array[lVar4 + -1] = (ulong)pSVar3 % bytes;
    pSVar3 = (StringUtil *)((ulong)pSVar3 / bytes);
  }
  lVar4 = 5;
  do {
    lVar5 = lVar4 + -1;
    if (lVar4 == 0) {
      ::std::__cxx11::to_string(&bStack_f8,array[0]);
      __rhs = " bytes";
      if (this == (StringUtil *)0x1) {
        __rhs = " byte";
      }
      ::std::operator+(__return_storage_ptr__,&bStack_f8,__rhs);
      goto LAB_00332dcf;
    }
    puVar1 = array + lVar4;
    lVar4 = lVar5;
  } while (*puVar1 == 0);
  iVar2 = array[lVar5];
  ::std::__cxx11::to_string(&local_48,*puVar1);
  ::std::operator+(&local_88,&local_48,".");
  ::std::__cxx11::to_string(&local_a8,(iVar2 * 10) / bytes);
  ::std::operator+(&local_68,&local_88,&local_a8);
  ::std::operator+(&bStack_f8,&local_68," ");
  ::std::operator+(__return_storage_ptr__,&bStack_f8,
                   (&PTR_anon_var_dwarf_bc0b_01776478)[(ulong)(bytes == 1000) * 6 + lVar5]);
  ::std::__cxx11::string::~string((string *)&bStack_f8);
  ::std::__cxx11::string::~string((string *)&local_68);
  ::std::__cxx11::string::~string((string *)&local_a8);
  ::std::__cxx11::string::~string((string *)&local_88);
  this_00 = &local_48;
LAB_00332dcf:
  ::std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

string StringUtil::BytesToHumanReadableString(idx_t bytes, idx_t multiplier) {
	D_ASSERT(multiplier == 1000 || multiplier == 1024);
	idx_t array[6] = {};
	const char *unit[2][6] = {{"bytes", "KiB", "MiB", "GiB", "TiB", "PiB"}, {"bytes", "kB", "MB", "GB", "TB", "PB"}};

	const int sel = (multiplier == 1000);

	array[0] = bytes;
	for (idx_t i = 1; i < 6; i++) {
		array[i] = array[i - 1] / multiplier;
		array[i - 1] %= multiplier;
	}

	for (idx_t i = 5; i >= 1; i--) {
		if (array[i]) {
			// Map 0 -> 0 and (multiplier-1) -> 9
			idx_t fractional_part = (array[i - 1] * 10) / multiplier;
			return to_string(array[i]) + "." + to_string(fractional_part) + " " + unit[sel][i];
		}
	}

	return to_string(array[0]) + (bytes == 1 ? " byte" : " bytes");
}